

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

void trie_iterate_recursive(trie t,trie_cb_iterate iterate_cb,trie_cb_iterate_args args)

{
  long in_RSI;
  trie_cb_iterate_args in_RDI;
  
  if ((in_RDI != (trie_cb_iterate_args)0x0) && (in_RSI != 0)) {
    trie_node_iterate_recursive(t,(trie_node)iterate_cb,(trie_cb_iterate)args,in_RDI);
  }
  return;
}

Assistant:

void trie_iterate_recursive(trie t, trie_cb_iterate iterate_cb, trie_cb_iterate_args args)
{
	if (t != NULL && iterate_cb != NULL)
	{
		trie_node_iterate_recursive(t, t->root, iterate_cb, args);
	}
}